

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall QList<QPointer<QMdiSubWindow>_>::begin(QList<QPointer<QMdiSubWindow>_> *this)

{
  QPointer<QMdiSubWindow> *n;
  QArrayDataPointer<QPointer<QMdiSubWindow>_> *in_RDI;
  long in_FS_OFFSET;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<QPointer<QMdiSubWindow>_> *)0x6287d9);
  QArrayDataPointer<QPointer<QMdiSubWindow>_>::operator->(in_RDI);
  n = QArrayDataPointer<QPointer<QMdiSubWindow>_>::begin
                ((QArrayDataPointer<QPointer<QMdiSubWindow>_> *)0x6287ea);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator begin() { detach(); return iterator(d->begin()); }